

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  size_t __n;
  size_t __n_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  json_t *json;
  void *pvVar5;
  json_t *pjVar6;
  char *pcVar7;
  json_error_code jVar8;
  
  uVar4 = lex->depth + 1;
  lex->depth = uVar4;
  if (0x800 < uVar4) {
    pcVar7 = "maximum parsing depth reached";
    jVar8 = json_error_stack_overflow;
    goto LAB_00118df0;
  }
  iVar3 = lex->token;
  if (iVar3 < 0x100) {
    if (iVar3 == -1) {
      pcVar7 = "invalid token";
      goto LAB_00119106;
    }
    if (iVar3 == 0x5b) {
      json = json_array();
      if (json != (json_t *)0x0) {
        lex_scan(lex,error);
        if (lex->token != 0x5d) {
          do {
            if (lex->token == 0) goto LAB_001190bc;
            pjVar6 = parse_value(lex,flags,error);
            iVar3 = 4;
            if ((pjVar6 != (json_t *)0x0) &&
               (iVar2 = json_array_append_new(json,pjVar6), iVar2 == 0)) {
              lex_scan(lex,error);
              iVar3 = 3;
              if (lex->token == 0x2c) {
                lex_scan(lex,error);
                iVar3 = 0;
              }
            }
          } while (iVar3 == 0);
          if (iVar3 == 4) {
LAB_00119178:
            json_delete(json);
            goto LAB_00119180;
          }
          if (iVar3 == 3) {
LAB_001190bc:
            if (lex->token != 0x5d) {
              pcVar7 = "\']\' expected";
LAB_00119166:
              error_set(error,lex,json_error_invalid_syntax,pcVar7);
              goto LAB_00119178;
            }
          }
        }
        goto LAB_001190f4;
      }
    }
    else {
      if (iVar3 != 0x7b) goto switchD_00118e25_default;
      json = json_object();
      if (json != (json_t *)0x0) {
        lex_scan(lex,error);
        if (lex->token != 0x7d) {
          do {
            if (lex->token != 0x100) {
              jVar8 = json_error_invalid_syntax;
              pcVar7 = "string or \'}\' expected";
              goto LAB_00118f18;
            }
            pcVar7 = (lex->value).string.val;
            __n_00 = (lex->value).string.len;
            (lex->value).string.val = (char *)0x0;
            (lex->value).string.len = 0;
            if (pcVar7 == (char *)0x0) {
              iVar3 = 1;
            }
            else {
              pvVar5 = memchr(pcVar7,0,__n_00);
              if (pvVar5 == (void *)0x0) {
                if (((flags & 1) != 0) &&
                   (pjVar6 = json_object_getn(json,pcVar7,__n_00), pjVar6 != (json_t *)0x0)) {
                  jsonp_free(pcVar7);
                  jVar8 = json_error_duplicate_key;
                  pcVar7 = "duplicate object key";
                  goto LAB_00118f18;
                }
                lex_scan(lex,error);
                if (lex->token != 0x3a) {
                  jsonp_free(pcVar7);
                  jVar8 = json_error_invalid_syntax;
                  pcVar7 = "\':\' expected";
                  goto LAB_00118f18;
                }
                lex_scan(lex,error);
                pjVar6 = parse_value(lex,flags,error);
                if (pjVar6 != (json_t *)0x0) {
                  iVar2 = json_object_setn_new_nocheck(json,pcVar7,__n_00,pjVar6);
                  jsonp_free(pcVar7);
                  iVar3 = 4;
                  if (iVar2 == 0) {
                    lex_scan(lex,error);
                    iVar3 = 3;
                    if (lex->token == 0x2c) {
                      lex_scan(lex,error);
                      iVar3 = 0;
                    }
                  }
                  goto LAB_00118f24;
                }
                jsonp_free(pcVar7);
              }
              else {
                jsonp_free(pcVar7);
                jVar8 = json_error_null_byte_in_key;
                pcVar7 = "NUL byte in object key not supported";
LAB_00118f18:
                error_set(error,lex,jVar8,pcVar7);
              }
              iVar3 = 4;
            }
LAB_00118f24:
          } while (iVar3 == 0);
          if (iVar3 == 4) goto LAB_00119178;
          if (iVar3 != 3) goto LAB_00119180;
          if (lex->token != 0x7d) {
            pcVar7 = "\'}\' expected";
            goto LAB_00119166;
          }
        }
        goto LAB_001190f4;
      }
    }
LAB_00119180:
    json = (json_t *)0x0;
    goto LAB_001190f4;
  }
  switch(iVar3) {
  case 0x100:
    json = (json_t *)(lex->value).string.val;
    __n = (lex->value).string.len;
    if (((flags & 0x10) == 0) && (pvVar5 = memchr(json,0,__n), pvVar5 != (void *)0x0)) {
      bVar1 = false;
      error_set(error,lex,json_error_null_character,"\\u0000 is not allowed without JSON_ALLOW_NUL")
      ;
    }
    else {
      json = jsonp_stringn_nocheck_own((char *)json,__n);
      (lex->value).string.val = (char *)0x0;
      (lex->value).string.len = 0;
      bVar1 = true;
    }
    if (bVar1) break;
    goto LAB_0011913a;
  case 0x101:
    json = json_integer((lex->value).integer);
    break;
  case 0x102:
    json = json_real((lex->value).real);
    break;
  case 0x103:
    json = json_true();
    break;
  case 0x104:
    json = json_false();
    break;
  case 0x105:
    json = json_null();
    break;
  default:
switchD_00118e25_default:
    pcVar7 = "unexpected token";
LAB_00119106:
    jVar8 = json_error_invalid_syntax;
LAB_00118df0:
    error_set(error,lex,jVar8,pcVar7);
    return (json_t *)0x0;
  }
LAB_001190f4:
  if (json == (json_t *)0x0) {
LAB_0011913a:
    json = (json_t *)0x0;
  }
  else {
    lex->depth = lex->depth - 1;
  }
  return json;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error) {
    json_t *json;

    lex->depth++;
    if (lex->depth > JSON_PARSER_MAX_DEPTH) {
        error_set(error, lex, json_error_stack_overflow, "maximum parsing depth reached");
        return NULL;
    }

    switch (lex->token) {
        case TOKEN_STRING: {
            const char *value = lex->value.string.val;
            size_t len = lex->value.string.len;

            if (!(flags & JSON_ALLOW_NUL)) {
                if (memchr(value, '\0', len)) {
                    error_set(error, lex, json_error_null_character,
                              "\\u0000 is not allowed without JSON_ALLOW_NUL");
                    return NULL;
                }
            }

            json = jsonp_stringn_nocheck_own(value, len);
            lex->value.string.val = NULL;
            lex->value.string.len = 0;
            break;
        }

        case TOKEN_INTEGER: {
            json = json_integer(lex->value.integer);
            break;
        }

        case TOKEN_REAL: {
            json = json_real(lex->value.real);
            break;
        }

        case TOKEN_TRUE:
            json = json_true();
            break;

        case TOKEN_FALSE:
            json = json_false();
            break;

        case TOKEN_NULL:
            json = json_null();
            break;

        case '{':
            json = parse_object(lex, flags, error);
            break;

        case '[':
            json = parse_array(lex, flags, error);
            break;

        case TOKEN_INVALID:
            error_set(error, lex, json_error_invalid_syntax, "invalid token");
            return NULL;

        default:
            error_set(error, lex, json_error_invalid_syntax, "unexpected token");
            return NULL;
    }

    if (!json)
        return NULL;

    lex->depth--;
    return json;
}